

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O2

date_t __thiscall
duckdb::TimeBucket::OriginWidthConvertibleToMicrosTernaryOperator::
Operation<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t>
          (OriginWidthConvertibleToMicrosTernaryOperator *this,interval_t bucket_width,date_t ts,
          date_t origin)

{
  bool bVar1;
  date_t dVar2;
  int64_t bucket_width_micros;
  timestamp_t tVar3;
  int64_t ts_micros;
  int64_t origin_micros;
  OriginWidthConvertibleToMicrosTernaryOperator *local_30;
  int64_t local_28;
  
  local_28 = bucket_width._0_8_;
  dVar2.days = bucket_width.micros._0_4_;
  local_30 = this;
  bVar1 = Value::IsFinite<duckdb::date_t>(dVar2);
  if (bVar1) {
    bucket_width_micros = Interval::GetMicro((interval_t *)&local_30);
    tVar3 = Cast::Operation<duckdb::date_t,duckdb::timestamp_t>(dVar2);
    ts_micros = Timestamp::GetEpochMicroSeconds(tVar3);
    tVar3 = Cast::Operation<duckdb::date_t,duckdb::timestamp_t>(ts);
    origin_micros = Timestamp::GetEpochMicroSeconds(tVar3);
    tVar3 = WidthConvertibleToMicrosCommon(bucket_width_micros,ts_micros,origin_micros);
    dVar2 = Cast::Operation<duckdb::timestamp_t,duckdb::date_t>(tVar3);
    return (date_t)dVar2.days;
  }
  dVar2 = Cast::Operation<duckdb::date_t,duckdb::date_t>(dVar2);
  return (date_t)dVar2.days;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC origin) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int64_t bucket_width_micros = Interval::GetMicro(bucket_width);
			int64_t ts_micros = Timestamp::GetEpochMicroSeconds(Cast::template Operation<TB, timestamp_t>(ts));
			int64_t origin_micros = Timestamp::GetEpochMicroSeconds(Cast::template Operation<TB, timestamp_t>(origin));
			return Cast::template Operation<timestamp_t, TR>(
			    WidthConvertibleToMicrosCommon(bucket_width_micros, ts_micros, origin_micros));
		}